

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O2

void __thiscall
eos::render::Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
          (Rasterizer<eos::render::TexturingFragmentShader> *this,Vertex<float> *point_a,
          Vertex<float> *point_b,Vertex<float> *point_c,optional<eos::render::Texture> *texture)

{
  Image4u *this_00;
  char cVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *pPVar10;
  int y;
  ulong uVar11;
  double *pdVar12;
  Texture *pTVar13;
  Pixel<unsigned_char,_4> *pPVar14;
  int xi;
  int x;
  float y_00;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Rect<int> RVar31;
  plane gamma_plane;
  Vector3<float> local_148;
  float fStack_13c;
  undefined1 local_130 [24];
  plane beta_plane;
  plane alpha_plane;
  Vector3<float> local_40;
  
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  alpha_plane.a = (pPVar10->m_storage).m_data.array[0];
  alpha_plane.b = (pPVar10->m_storage).m_data.array[1];
  pPVar10 = &(point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  beta_plane.a = (pPVar10->m_storage).m_data.array[0];
  beta_plane.b = (pPVar10->m_storage).m_data.array[1];
  pPVar10 = &(point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  RVar31 = detail::calculate_clipped_bounding_box<float>
                     ((Vector2<float> *)&alpha_plane,(Vector2<float> *)&beta_plane,
                      (Vector2<float> *)&gamma_plane,this->viewport_width,this->viewport_height);
  uVar11 = RVar31._0_8_ >> 0x20;
  beta_plane.c = (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                 m_storage.m_data.array[0] *
                 (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[3];
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  beta_plane.a = (pPVar10->m_storage).m_data.array[0];
  beta_plane.b = (pPVar10->m_storage).m_data.array[1];
  gamma_plane.c =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  pPVar10 = &(point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  detail::plane::plane<float>
            (&alpha_plane,(Vector3<float> *)&beta_plane,(Vector3<float> *)&gamma_plane,&local_148);
  gamma_plane.c =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_130._8_4_ =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_130._0_8_ =
       *(undefined8 *)
        (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
        m_data.array;
  detail::plane::plane<float>
            (&beta_plane,(Vector3<float> *)&gamma_plane,&local_148,(Vector3<float> *)local_130);
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_130._0_8_ =
       *(undefined8 *)
        (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
        m_data.array;
  local_130._8_4_ =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<float>(&gamma_plane,&local_148,(Vector3<float> *)local_130,&local_40);
  local_130._20_4_ = 1.0 / alpha_plane.c;
  local_130._16_4_ = 1.0 / beta_plane.c;
  local_130._12_4_ = 1.0 / gamma_plane.c;
  fVar23 = -alpha_plane.a * (float)local_130._20_4_;
  fVar24 = -beta_plane.a * (float)local_130._16_4_;
  fVar25 = -gamma_plane.a * (float)local_130._12_4_;
  fVar27 = -alpha_plane.b * (float)local_130._20_4_;
  fVar29 = -beta_plane.b * (float)local_130._16_4_;
  fVar30 = -gamma_plane.b * (float)local_130._12_4_;
  this_00 = &this->colorbuffer;
  do {
    y = (int)uVar11;
    if (RVar31.height + RVar31.y < y) {
      return;
    }
    y_00 = (float)y + 0.5;
    uVar11 = RVar31._0_8_ & 0xffffffff;
    while (x = (int)uVar11, x <= RVar31.width + RVar31.x) {
      fVar15 = (float)x + 0.5;
      dVar3 = detail::implicit_line<float>
                        ((point_a->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[0],
                         (point_a->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[1],&point_b->position,&point_c->position);
      dVar20 = detail::implicit_line<float>
                         ((point_b->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0],
                          (point_b->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[1],&point_c->position,&point_a->position);
      dVar4 = detail::implicit_line<float>
                        ((point_c->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[0],
                         (point_c->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[1],&point_a->position,&point_b->position);
      dVar5 = detail::implicit_line<float>(fVar15,y_00,&point_b->position,&point_c->position);
      dVar6 = detail::implicit_line<float>(fVar15,y_00,&point_c->position,&point_a->position);
      auVar22._8_4_ = SUB84(dVar20,0);
      auVar22._0_8_ = dVar3;
      auVar22._12_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar22 = divpd(_DAT_00183150,auVar22);
      dVar5 = dVar5 * auVar22._0_8_;
      dVar6 = dVar6 * auVar22._8_8_;
      auVar8._8_4_ = SUB84(dVar6,0);
      auVar8._0_8_ = dVar5;
      auVar8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      dVar3 = detail::implicit_line<float>(fVar15,y_00,&point_a->position,&point_b->position);
      if (((0.0 <= dVar5) && (0.0 <= auVar8._8_8_)) && (dVar3 = (1.0 / dVar4) * dVar3, 0.0 <= dVar3)
         ) {
        dVar20 = (double)(point_c->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2] * dVar3 +
                 (double)(point_a->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2] * dVar5 +
                 auVar8._8_8_ *
                 (double)(point_b->position).
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2];
        cVar1 = this->enable_depth_test;
        if ((bool)cVar1 == true) {
          bVar2 = this->enable_far_clipping;
          pdVar12 = core::Image<double>::operator()(&this->depthbuffer,y,x);
          if ((byte)(*pdVar12 <= dVar20 | 1.0 < dVar20 & bVar2) == 1) {
            cVar1 = this->enable_depth_test;
            goto joined_r0x0017d035;
          }
        }
        else {
joined_r0x0017d035:
          if (cVar1 != '\0') goto LAB_0017d3f6;
        }
        if (this->perspective_correct_barycentric_weights == true) {
          dVar21 = (double)(point_c->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
          dVar4 = (double)(point_a->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[3];
          dVar7 = (double)(point_b->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[3];
          dVar9 = 1.0 / (dVar3 * dVar21 + dVar5 * dVar4 + dVar6 * dVar7);
          dVar5 = dVar5 * dVar9 * dVar4;
          dVar6 = dVar6 * dVar9 * dVar7;
          dVar3 = dVar3 * dVar9 * dVar21;
        }
        local_130._8_4_ = (undefined4)dVar3;
        local_130._0_8_ = CONCAT44((float)dVar6,(float)dVar5);
        if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
            super__Optional_payload<eos::render::Texture,_true,_false,_false>.
            super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
          fVar28 = -(gamma_plane.a * fVar15 + gamma_plane.b * y_00 + gamma_plane.d) *
                   (float)local_130._12_4_;
          fVar26 = 1.0 / (fVar28 * fVar28);
          fVar16 = (alpha_plane.a * fVar15 + alpha_plane.b * y_00 + alpha_plane.d) *
                   (float)local_130._20_4_;
          fVar19 = (beta_plane.a * fVar15 + beta_plane.b * y_00 + beta_plane.d) *
                   (float)local_130._16_4_;
          pTVar13 = std::optional<eos::render::Texture>::value(texture);
          fVar17 = (float)((pTVar13->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->width_ *
                   (fVar23 * fVar28 + fVar25 * fVar16) * fVar26;
          pTVar13 = std::optional<eos::render::Texture>::value(texture);
          fVar18 = (float)((pTVar13->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->width_ *
                   (fVar24 * fVar28 + fVar25 * fVar19) * fVar26;
          pTVar13 = std::optional<eos::render::Texture>::value(texture);
          fVar16 = (float)((pTVar13->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->height_ *
                   (fVar27 * fVar28 + fVar16 * fVar30) * fVar26;
          pTVar13 = std::optional<eos::render::Texture>::value(texture);
          fVar26 = (float)((pTVar13->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->height_ *
                   (fVar28 * fVar29 + fVar19 * fVar30) * fVar26;
        }
        else {
          fVar17 = 0.0;
          fVar18 = 0.0;
          fVar16 = 0.0;
          fVar26 = 0.0;
        }
        TexturingFragmentShader::shade_triangle_pixel<float>
                  ((TexturingFragmentShader *)&local_148,(int)this,(int)fVar15,
                   (Vertex<float> *)(ulong)(uint)(int)y_00,point_a,point_b,(Vector3<float> *)point_c
                   ,(optional<eos::render::Texture> *)local_130,fVar17,fVar18,fVar16,fVar26);
        fVar15 = 1.0;
        if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] <= 1.0) {
          fVar15 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        }
        fVar18 = 1.0;
        if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] <= 1.0) {
          fVar18 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
        }
        fVar16 = 1.0;
        if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] <= 1.0) {
          fVar16 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
        }
        fVar17 = 1.0;
        if (fStack_13c <= 1.0) {
          fVar17 = fStack_13c;
        }
        pPVar14 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_00,y,x);
        (pPVar14->data_)._M_elems[0] = (uchar)(int)(fVar16 * 255.0);
        pPVar14 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_00,y,x);
        (pPVar14->data_)._M_elems[1] = (uchar)(int)(fVar18 * 255.0);
        pPVar14 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_00,y,x);
        (pPVar14->data_)._M_elems[2] = (uchar)(int)(fVar15 * 255.0);
        pPVar14 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_00,y,x);
        (pPVar14->data_)._M_elems[3] = (uchar)(int)(fVar17 * 255.0);
        if (this->enable_depth_test == true) {
          pdVar12 = core::Image<double>::operator()(&this->depthbuffer,y,x);
          *pdVar12 = dVar20;
        }
      }
LAB_0017d3f6:
      uVar11 = (ulong)(x + 1);
    }
    uVar11 = (ulong)(y + 1);
  } while( true );
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }